

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O0

void __thiscall booster::aio::epoll_reactor::epoll_reactor(epoll_reactor *this)

{
  int iVar1;
  char *pcVar2;
  error_category *in_RDI;
  base_poll_reactor *in_stack_ffffffffffffffd0;
  char *pcVar3;
  int in_stack_ffffffffffffffec;
  system_error *in_stack_fffffffffffffff0;
  
  base_poll_reactor::base_poll_reactor(in_stack_ffffffffffffffd0);
  base_fast_reactor::base_fast_reactor((base_fast_reactor *)0x2109c6);
  *(undefined ***)in_RDI = &PTR_select_002e8970;
  iVar1 = epoll_create(0x10);
  *(int *)(in_RDI + 0x20) = iVar1;
  if (*(int *)(in_RDI + 0x20) == 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x40);
    pcVar3 = pcVar2;
    __errno_location();
    system::system_error::system_error
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_RDI,pcVar3);
    __cxa_throw(pcVar2,&system::system_error::typeinfo,system::system_error::~system_error);
  }
  return;
}

Assistant:

epoll_reactor() 
		{
			pollfd_=::epoll_create(16);
			if(!pollfd_)
				throw system::system_error(errno,syscat,"Failed to create epoll descriptor");
		}